

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_conversion.cpp
# Opt level: O3

void duckdb::ConvertDecimal<duckdb::hugeint_t*>
               (hugeint_t *src_ptr,Vector *vector,ArrowArray *array,idx_t size,int64_t nested_offset
               ,uint64_t parent_offset,ArrowScanLocalState *scan_state,ValidityMask *val_mask,
               DecimalBitWidth arrow_bit_width)

{
  PhysicalType type;
  unsigned_long *puVar1;
  void *pvVar2;
  idx_t iVar3;
  long lVar4;
  NotImplementedException *this;
  PhysicalType type_00;
  undefined1 strict;
  ulong uVar5;
  int64_t *piVar6;
  data_ptr_t pdVar7;
  hugeint_t *result;
  hugeint_t input;
  hugeint_t input_00;
  hugeint_t input_01;
  hugeint_t input_02;
  string local_70;
  string local_50;
  
  strict = (undefined1)nested_offset;
  type = (vector->type).physical_type_;
  if (type < INT64) {
    if (type == INT16) {
      if (size == 0) {
        return;
      }
      pdVar7 = vector->data;
      piVar6 = &src_ptr->upper;
      uVar5 = 0;
      do {
        puVar1 = (val_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if ((puVar1 == (unsigned_long *)0x0) || ((puVar1[uVar5 >> 6] >> (uVar5 & 0x3f) & 1) != 0)) {
          input_01.upper = (int64_t)pdVar7;
          input_01.lower = *piVar6;
          TryCast::Operation<duckdb::hugeint_t,short>
                    ((TryCast *)((hugeint_t *)(piVar6 + -1))->lower,input_01,(int16_t *)0x0,
                     (bool)strict);
        }
        uVar5 = uVar5 + 1;
        pdVar7 = pdVar7 + 2;
        piVar6 = piVar6 + 2;
      } while (size != uVar5);
      return;
    }
    if (type != INT32) {
LAB_011853ba:
      this = (NotImplementedException *)__cxa_allocate_exception(0x10);
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_70,"Unsupported physical type for Decimal: %s","");
      TypeIdToString_abi_cxx11_(&local_50,(duckdb *)(ulong)(vector->type).physical_type_,type_00);
      NotImplementedException::NotImplementedException<std::__cxx11::string>
                (this,&local_70,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_50);
      __cxa_throw(this,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    }
    if (arrow_bit_width != DECIMAL_32) {
      if (size == 0) {
        return;
      }
      pdVar7 = vector->data;
      piVar6 = &src_ptr->upper;
      uVar5 = 0;
      do {
        puVar1 = (val_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if ((puVar1 == (unsigned_long *)0x0) || ((puVar1[uVar5 >> 6] >> (uVar5 & 0x3f) & 1) != 0)) {
          input_00.upper = (int64_t)pdVar7;
          input_00.lower = *piVar6;
          TryCast::Operation<duckdb::hugeint_t,int>
                    ((TryCast *)((hugeint_t *)(piVar6 + -1))->lower,input_00,(int32_t *)0x0,
                     (bool)strict);
        }
        uVar5 = uVar5 + 1;
        pdVar7 = pdVar7 + 4;
        piVar6 = piVar6 + 2;
      } while (size != uVar5);
      return;
    }
  }
  else if (type == INT64) {
    if (arrow_bit_width != DECIMAL_64) {
      if (size == 0) {
        return;
      }
      pdVar7 = vector->data;
      piVar6 = &src_ptr->upper;
      uVar5 = 0;
      do {
        puVar1 = (val_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if ((puVar1 == (unsigned_long *)0x0) || ((puVar1[uVar5 >> 6] >> (uVar5 & 0x3f) & 1) != 0)) {
          input_02.upper = (int64_t)pdVar7;
          input_02.lower = *piVar6;
          TryCast::Operation<duckdb::hugeint_t,long>
                    ((TryCast *)((hugeint_t *)(piVar6 + -1))->lower,input_02,(int64_t *)0x0,
                     (bool)strict);
        }
        uVar5 = uVar5 + 1;
        pdVar7 = pdVar7 + 8;
        piVar6 = piVar6 + 2;
      } while (size != uVar5);
      return;
    }
  }
  else {
    if (type != INT128) goto LAB_011853ba;
    if (arrow_bit_width != DECIMAL_128) {
      if (size == 0) {
        return;
      }
      result = (hugeint_t *)vector->data;
      piVar6 = &src_ptr->upper;
      uVar5 = 0;
      do {
        puVar1 = (val_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if ((puVar1 == (unsigned_long *)0x0) || ((puVar1[uVar5 >> 6] >> (uVar5 & 0x3f) & 1) != 0)) {
          input.upper = *piVar6;
          input.lower = ((hugeint_t *)(piVar6 + -1))->lower;
          TryCast::Operation<duckdb::hugeint_t,duckdb::hugeint_t>(input,result,false);
        }
        uVar5 = uVar5 + 1;
        result = result + 1;
        piVar6 = piVar6 + 2;
      } while (size != uVar5);
      return;
    }
  }
  pvVar2 = array->buffers[1];
  iVar3 = GetTypeIdSize(type);
  lVar4 = NumericCastImpl<long,_unsigned_long,_false>::Convert(parent_offset);
  lVar4 = lVar4 + array->offset + scan_state->chunk_offset;
  if (nested_offset != -1) {
    lVar4 = array->offset + nested_offset;
  }
  vector->data = (data_ptr_t)(lVar4 * iVar3 + (long)pvVar2);
  return;
}

Assistant:

void ConvertDecimal(SRC src_ptr, Vector &vector, ArrowArray &array, idx_t size, int64_t nested_offset,
                    uint64_t parent_offset, ArrowScanLocalState &scan_state, ValidityMask &val_mask,
                    DecimalBitWidth arrow_bit_width) {

	switch (vector.GetType().InternalType()) {
	case PhysicalType::INT16: {
		auto tgt_ptr = FlatVector::GetData<int16_t>(vector);
		for (idx_t row = 0; row < size; row++) {
			if (val_mask.RowIsValid(row)) {
				auto result = TryCast::Operation(src_ptr[row], tgt_ptr[row]);
				D_ASSERT(result);
				(void)result;
			}
		}
		break;
	}
	case PhysicalType::INT32: {
		if (arrow_bit_width == DecimalBitWidth::DECIMAL_32) {
			FlatVector::SetData(vector, ArrowBufferData<data_t>(array, 1) +
			                                GetTypeIdSize(vector.GetType().InternalType()) *
			                                    GetEffectiveOffset(array, NumericCast<int64_t>(parent_offset),
			                                                       scan_state, nested_offset));
		} else {
			auto tgt_ptr = FlatVector::GetData<int32_t>(vector);
			for (idx_t row = 0; row < size; row++) {
				if (val_mask.RowIsValid(row)) {
					auto result = TryCast::Operation(src_ptr[row], tgt_ptr[row]);
					D_ASSERT(result);
					(void)result;
				}
			}
		}
		break;
	}
	case PhysicalType::INT64: {
		if (arrow_bit_width == DecimalBitWidth::DECIMAL_64) {
			FlatVector::SetData(vector, ArrowBufferData<data_t>(array, 1) +
			                                GetTypeIdSize(vector.GetType().InternalType()) *
			                                    GetEffectiveOffset(array, NumericCast<int64_t>(parent_offset),
			                                                       scan_state, nested_offset));
		} else {
			auto tgt_ptr = FlatVector::GetData<int64_t>(vector);
			for (idx_t row = 0; row < size; row++) {
				if (val_mask.RowIsValid(row)) {
					auto result = TryCast::Operation(src_ptr[row], tgt_ptr[row]);
					D_ASSERT(result);
					(void)result;
				}
			}
		}
		break;
	}
	case PhysicalType::INT128: {
		if (arrow_bit_width == DecimalBitWidth::DECIMAL_128) {
			FlatVector::SetData(vector, ArrowBufferData<data_t>(array, 1) +
			                                GetTypeIdSize(vector.GetType().InternalType()) *
			                                    GetEffectiveOffset(array, NumericCast<int64_t>(parent_offset),
			                                                       scan_state, nested_offset));
		} else {
			auto tgt_ptr = FlatVector::GetData<hugeint_t>(vector);
			for (idx_t row = 0; row < size; row++) {
				if (val_mask.RowIsValid(row)) {
					auto result = TryCast::Operation(src_ptr[row], tgt_ptr[row]);
					D_ASSERT(result);
					(void)result;
				}
			}
		}

		break;
	}
	default:
		throw NotImplementedException("Unsupported physical type for Decimal: %s",
		                              TypeIdToString(vector.GetType().InternalType()));
	}
}